

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int patchtestreg(FuncState *fs,int node,int reg)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  
  puVar2 = fs->f->code + node;
  if ((0 < node) && ((char)luaP_opmodes[(byte)puVar2[-1]] < '\0')) {
    puVar2 = puVar2 + -1;
  }
  uVar1 = *puVar2;
  iVar3 = 0;
  if ((char)uVar1 == '#') {
    if ((reg == 0x7f) || (uVar1 >> 0x18 == reg)) {
      *puVar2 = uVar1 & 0xff0022 | uVar1 >> 0x10 & 0xff00;
      iVar3 = 1;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; generate OP_TEST\n");
      }
    }
    else {
      *(byte *)((long)puVar2 + 1) = (byte)reg & 0x7f;
      iVar3 = 1;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)*puVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i)) {
    SETARG_A(*i, reg);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", *i, reg));
  }
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; generate OP_TEST\n", *i));
  }
  return 1;
}